

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

void __thiscall draco::CornerTable::UpdateFaceToVertexMap(CornerTable *this,VertexIndex vertex)

{
  bool bVar1;
  CornerIndex CVar2;
  reference this_00;
  undefined4 in_ESI;
  VertexCornersIterator<draco::CornerTable> *in_RDI;
  CornerIndex corner;
  VertexCornersIterator<draco::CornerTable> it;
  undefined4 in_stack_ffffffffffffffd0;
  VertexCornersIterator<draco::CornerTable> *in_stack_ffffffffffffffd8;
  VertexIndex in_stack_ffffffffffffffe4;
  ThisIndexType local_4;
  
  VertexCornersIterator<draco::CornerTable>::VertexCornersIterator
            (in_stack_ffffffffffffffd8,(CornerTable *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffe4);
  while( true ) {
    bVar1 = VertexCornersIterator<draco::CornerTable>::End
                      ((VertexCornersIterator<draco::CornerTable> *)0x1b4eb6);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    CVar2 = VertexCornersIterator<draco::CornerTable>::operator*(in_RDI);
    this_00 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
              ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                            *)CONCAT44(in_ESI,CVar2.value_),
                           (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_RDI);
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(this_00,&local_4);
    VertexCornersIterator<draco::CornerTable>::operator++
              ((VertexCornersIterator<draco::CornerTable> *)CONCAT44(in_ESI,CVar2.value_));
  }
  return;
}

Assistant:

void CornerTable::UpdateFaceToVertexMap(const VertexIndex vertex) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  VertexCornersIterator<CornerTable> it(this, vertex);
  for (; !it.End(); ++it) {
    const CornerIndex corner = *it;
    corner_to_vertex_map_[corner] = vertex;
  }
}